

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

StatusOr<bool> * __thiscall
draco::PlyReader::ParseEndHeader
          (StatusOr<bool> *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  long lVar1;
  int iVar2;
  allocator<char> local_71;
  array<char,_10UL> c;
  string local_60 [32];
  undefined1 local_40 [40];
  
  parser::SkipWhitespace(buffer);
  lVar1 = buffer->pos_;
  if (buffer->data_size_ < lVar1 + 10) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_60,"End of file reached before the end_header",&local_71);
    local_40._0_4_ = INVALID_PARAMETER;
    std::__cxx11::string::string((string *)(local_40 + 8),local_60);
    Status::Status(&__return_storage_ptr__->status_,(Status *)local_40);
    std::__cxx11::string::~string((string *)(local_40 + 8));
    std::__cxx11::string::~string(local_60);
  }
  else {
    c._M_elems._8_2_ = *(undefined2 *)(buffer->data_ + lVar1 + 8);
    c._M_elems._0_8_ = *(undefined8 *)(buffer->data_ + lVar1);
    iVar2 = bcmp(&c,"end_header",10);
    if (iVar2 == 0) {
      parser::SkipLine(buffer);
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = true;
    }
    else {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<bool> PlyReader::ParseEndHeader(DecoderBuffer *buffer) {
  parser::SkipWhitespace(buffer);
  std::array<char, 10> c;
  if (!buffer->Peek(&c)) {
    return Status(Status::INVALID_PARAMETER,
                  "End of file reached before the end_header");
  }
  if (std::memcmp(&c[0], "end_header", 10) != 0) {
    return false;
  }
  parser::SkipLine(buffer);
  return true;
}